

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<unsigned_char>(Capturer *this,size_t index,uchar *value)

{
  string local_40;
  uchar *local_20;
  uchar *value_local;
  size_t index_local;
  Capturer *this_local;
  
  local_20 = value;
  value_local = (uchar *)index;
  index_local = (size_t)this;
  Detail::stringify<unsigned_char>(&local_40,value);
  captureValue(this,index,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void captureValues( size_t index, T const& value ) {
            captureValue( index, Catch::Detail::stringify( value ) );
        }